

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int AF_A_Burnination(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  VM_UBYTE VVar3;
  AActor *ent;
  undefined8 *puVar4;
  sector_t *psVar5;
  PClass *pPVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined8 uVar11;
  PClass *pPVar12;
  subsector_t *psVar13;
  AActor *pAVar14;
  VMValue *pVVar15;
  char *__assertion;
  bool bVar16;
  DVector2 pos;
  FSoundID local_54;
  double local_50;
  double dStack_48;
  DVector3 local_40;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d2c4d;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    pVVar15 = param;
    uVar8 = numparam;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar7 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar7);
      }
      pPVar12 = (ent->super_DThinker).super_DObject.Class;
      bVar16 = pPVar12 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar16;
      uVar8 = (uint)bVar16;
      pVVar15 = (VMValue *)(ulong)(pPVar12 == pPVar6 || bVar16);
      if (pPVar12 != pPVar6 && !bVar16) {
        do {
          pPVar12 = pPVar12->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar12 != (PClass *)0x0);
          if (pPVar12 == pPVar6) break;
        } while (pPVar12 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d2c4d;
      }
    }
    pPVar6 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar3 = param[1].field_0.field_3.Type, VVar3 != 0xff)) {
      if ((VVar3 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d2c22;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar11 = (**(code **)*puVar4)(puVar4,pVVar15,uVar8,ret);
          puVar4[1] = uVar11;
        }
        pPVar12 = (PClass *)puVar4[1];
        bVar16 = pPVar12 != (PClass *)0x0;
        if (pPVar12 != pPVar6 && bVar16) {
          do {
            pPVar12 = pPVar12->ParentClass;
            bVar16 = pPVar12 != (PClass *)0x0;
            if (pPVar12 == pPVar6) break;
          } while (pPVar12 != (PClass *)0x0);
        }
        if (!bVar16) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d2c4d;
        }
      }
    }
    if (((numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
       ((VVar3 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      (ent->Vel).Z = (ent->Vel).Z + -8.0;
      uVar8 = FRandom::GenRand32(&pr_phburn);
      uVar9 = FRandom::GenRand32(&pr_phburn);
      (ent->Vel).X = (double)(int)((uVar8 & 3) - (uVar9 & 3)) + (ent->Vel).X;
      uVar8 = FRandom::GenRand32(&pr_phburn);
      uVar9 = FRandom::GenRand32(&pr_phburn);
      (ent->Vel).Y = (double)(int)((uVar8 & 3) - (uVar9 & 3)) + (ent->Vel).Y;
      local_54.ID = S_FindSound("world/largefire");
      S_Sound(ent,2,&local_54,1.0,1.0);
      if (((ent->flags).Value & 0x20000) == 0) {
        uVar9 = FRandom::GenRand32(&pr_phburn);
        uVar10 = FRandom::GenRand32(&pr_phburn);
        uVar8 = -(uVar9 & 0x1f);
        if (-1 < (char)uVar9) {
          uVar8 = uVar9 & 0x1f;
        }
        uVar9 = -(uVar10 & 0x1f);
        if (-1 < (char)uVar10) {
          uVar9 = uVar10 & 0x1f;
        }
        P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,(double)(int)uVar8,(double)(int)uVar9);
        psVar13 = P_PointInSubsector(local_50,dStack_48);
        psVar5 = psVar13->sector;
        local_40.Z = (ent->__Pos).Z;
        if (ent->MaxStepHeight + local_40.Z <
            ((psVar5->floorplane).normal.Y * dStack_48 +
            (psVar5->floorplane).normal.X * local_50 + (psVar5->floorplane).D) *
            (psVar5->floorplane).negiC) {
          local_50 = (ent->__Pos).X;
          dStack_48 = (ent->__Pos).Y;
        }
        local_40.Z = local_40.Z + 4.0;
        local_40.X = local_50;
        local_40.Y = dStack_48;
        pAVar14 = AActor::StaticSpawn((PClassActor *)APhosphorousFire::RegistrationInfo.MyClass,
                                      &local_40,ALLOW_REPLACE,false);
        if (pAVar14 != (AActor *)0x0) {
          dVar2 = (ent->Vel).X;
          uVar8 = FRandom::GenRand32(&pr_phburn);
          uVar9 = FRandom::GenRand32(&pr_phburn);
          (pAVar14->Vel).X = (double)(int)((uVar8 & 7) - (uVar9 & 7)) + dVar2;
          dVar2 = (ent->Vel).Y;
          uVar8 = FRandom::GenRand32(&pr_phburn);
          uVar9 = FRandom::GenRand32(&pr_phburn);
          (pAVar14->Vel).Y = (double)(int)((uVar8 & 7) - (uVar9 & 7)) + dVar2;
          (pAVar14->Vel).Z = (ent->Vel).Z + -1.0;
          uVar8 = FRandom::GenRand32(&pr_phburn);
          pAVar14->reactiontime = (uVar8 & 3) + 2;
          pbVar1 = (byte *)((long)&(pAVar14->flags).Value + 2);
          *pbVar1 = *pbVar1 | 2;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d2c22:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d2c4d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x277,"int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burnination)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Z -= 8;
	self->Vel.X += (pr_phburn.Random2 (3));
	self->Vel.Y += (pr_phburn.Random2 (3));
	S_Sound (self, CHAN_VOICE, "world/largefire", 1, ATTN_NORM);

	// Only the main fire spawns more.
	if (!(self->flags & MF_DROPPED))
	{
		// Original x and y offsets seemed to be like this:
		//		x + (((pr_phburn() + 12) & 31) << F.RACBITS);
		//
		// But that creates a lop-sided burn because it won't use negative offsets.
		int xofs, xrand = pr_phburn();
		int yofs, yrand = pr_phburn();

		// Adding 12 is pointless if you're going to mask it afterward.
		xofs = xrand & 31;
		if (xrand & 128)
		{
			xofs = -xofs;
		}

		yofs = yrand & 31;
		if (yrand & 128)
		{
			yofs = -yofs;
		}

		DVector2 pos = self->Vec2Offset((double)xofs, (double)yofs);
		sector_t * sector = P_PointInSector(pos);

		// The sector's floor is too high so spawn the flame elsewhere.
		if (sector->floorplane.ZatPoint(pos) > self->Z() + self->MaxStepHeight)
		{
			pos = self->Pos();
		}

		AActor *drop = Spawn<APhosphorousFire> (DVector3(pos, self->Z() + 4.), ALLOW_REPLACE);
		if (drop != NULL)
		{
			drop->Vel.X = self->Vel.X + pr_phburn.Random2 (7);
			drop->Vel.Y = self->Vel.Y + pr_phburn.Random2 (7);
			drop->Vel.Z = self->Vel.Z - 1;
			drop->reactiontime = (pr_phburn() & 3) + 2;
			drop->flags |= MF_DROPPED;
		}
	}
	return 0;
}